

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_frEfr.cpp
# Opt level: O1

void DronePoseLib::ValtonenOrnhagArxiv2021::fast_eigenvector_solver
               (double *eigv,int neig,Matrix<double,_11,_11,_0,_11,_11> *AM,MatrixXcd *sols)

{
  complex<double> *pcVar1;
  double dVar2;
  ulong uVar3;
  int j;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  Index alignedStart;
  Matrix3d AA;
  Vector2d s;
  Matrix<double,_3,_11,_0,_3,_11> AMs;
  assign_op<double,_double> local_499;
  double local_498;
  undefined8 uStack_490;
  double local_488 [5];
  ulong local_460;
  ulong local_458;
  double local_450;
  double local_448;
  double local_440;
  double local_438;
  size_t local_430;
  void *local_428;
  void *local_420;
  double local_418;
  double local_410;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double *local_3e0;
  double *local_3d8;
  double dStack_3d0;
  double local_3c8;
  double local_3c0;
  double dStack_3b8;
  double local_3b0;
  double local_3a8;
  double dStack_3a0;
  double local_398;
  SrcXprType local_388;
  double *local_378 [2];
  double **local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 local_330;
  double local_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  double local_308;
  double dStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  Matrix<double,_2,_1,_0,_2,_1> local_278;
  double local_268 [33];
  ColPivHouseholderQR<Eigen::Matrix<double,_3,__1,_0,_3,_3>_> local_160;
  
  lVar5 = 0;
  do {
    lVar6 = (long)*(int *)((long)fast_eigenvector_solver::ind + lVar5);
    *(double *)((long)local_268 + lVar5 * 2) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar6];
    *(double *)((long)local_268 + lVar5 * 2 + 0x18) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar6 + 0xb];
    *(double *)((long)local_268 + lVar5 * 2 + 0x30) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar6 + 0x16];
    *(double *)((long)local_268 + lVar5 * 2 + 0x48) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar6 + 0x21];
    *(double *)((long)local_268 + lVar5 * 2 + 0x60) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar6 + 0x2c];
    *(double *)((long)local_268 + lVar5 * 2 + 0x78) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar6 + 0x37];
    *(double *)
     ((long)local_160.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,__1,_0,_3,_3>_>.m_storage.
            m_data.array + lVar5 * 2 + -0x78) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar6 + 0x42];
    *(double *)
     ((long)local_160.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,__1,_0,_3,_3>_>.m_storage.
            m_data.array + lVar5 * 2 + -0x60) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar6 + 0x4d];
    *(double *)
     ((long)(&local_160.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,__1,_0,_3,_3>_>.m_storage
              .m_data + 0xffffffffffffffff) + lVar5 * 2) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar6 + 0x58];
    *(double *)
     ((long)local_160.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,__1,_0,_3,_3>_>.m_storage.
            m_data.array + lVar5 * 2 + -0x30) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar6 + 99];
    *(double *)
     ((long)local_160.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,__1,_0,_3,_3>_>.m_storage.
            m_data.array + lVar5 * 2 + -0x18) =
         (AM->super_PlainObjectBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_>).m_storage.m_data.
         array[lVar6 + 0x6e];
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  if (0 < neig) {
    local_288 = local_268[0];
    dStack_280 = local_268[1];
    local_298 = local_268[6];
    dStack_290 = local_268[7];
    local_2a8 = local_268[0xc];
    dStack_2a0 = local_268[0xd];
    local_3e8 = local_268[2];
    local_3f0 = local_268[8];
    local_3f8 = local_268[0xe];
    local_2b8 = local_268[3];
    dStack_2b0 = local_268[4];
    local_2c8 = local_268[9];
    dStack_2c0 = local_268[10];
    local_2d8 = local_268[0x12];
    dStack_2d0 = local_268[0x13];
    local_2e8 = local_268[0x18];
    dStack_2e0 = local_268[0x19];
    local_400 = local_268[5];
    local_408 = local_268[0xb];
    local_410 = local_268[0x14];
    local_418 = local_268[0x1a];
    local_2f8 = local_268[0xf];
    dStack_2f0 = local_268[0x10];
    local_308 = local_268[0x15];
    dStack_300 = local_268[0x16];
    uVar3 = (ulong)local_378 >> 3;
    uVar8 = (uint)uVar3 & 1;
    uVar4 = 6 - uVar8 & 0xfffffffe;
    local_420 = (void *)((long)local_378 + (ulong)(uVar8 << 3));
    local_428 = (void *)((long)&local_3d8 + (ulong)(uVar8 << 3));
    local_430 = (ulong)(uVar4 * 8 + 0x38 & 0x30) + 0x10;
    local_458 = (ulong)(uint)neig;
    uVar7 = 0;
    local_460 = (ulong)((uVar4 + uVar8) * 8);
    local_318 = local_268[0x1b];
    dStack_310 = local_268[0x1c];
    local_328 = local_268[0x1e];
    dStack_320 = local_268[0x1f];
    local_438 = local_268[0x11];
    local_440 = local_268[0x17];
    local_448 = local_268[0x1d];
    local_450 = local_268[0x20];
    local_3e0 = eigv;
    do {
      local_498 = local_3e0[uVar7];
      lVar5 = 1;
      dVar2 = local_498;
      do {
        dVar2 = dVar2 * local_498;
        local_488[lVar5] = dVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      dStack_3d0 = local_488[1] * dStack_2a0 + local_488[2] * dStack_290 + local_488[3] * dStack_280
      ;
      local_3c8 = local_488[1] * local_3f8 + local_488[2] * local_3f0 + local_488[3] * local_3e8;
      local_3c0 = local_498 * local_2e8 +
                  local_488[1] * local_2d8 + local_488[2] * local_2c8 + local_488[3] * local_2b8;
      local_398 = (local_498 * local_448 + local_488[1] * local_440 + local_488[2] * local_438 +
                  local_450) - local_488[3];
      uStack_490 = 0;
      local_3b0 = local_498 * local_418 +
                  local_488[1] * local_410 + local_488[2] * local_408 + local_488[3] * local_400;
      local_3a8 = local_498 * local_318 + local_488[1] * local_308 + local_488[2] * local_2f8 +
                  local_328;
      dStack_3a0 = local_498 * dStack_310 + local_488[1] * dStack_300 + local_488[2] * dStack_2f0 +
                   dStack_320;
      local_3d8 = (double *)
                  ((local_488[1] * local_2a8 + local_488[2] * local_298 + local_488[3] * local_288)
                  - local_488[4]);
      dStack_3b8 = (local_498 * dStack_2e0 +
                   local_488[1] * dStack_2d0 + local_488[2] * dStack_2c0 + local_488[3] * dStack_2b0
                   ) - local_488[4];
      local_330 = 2;
      if ((uVar3 & 1) != 0) {
        local_378[0] = local_3d8;
      }
      memcpy(local_420,local_428,local_430);
      if ((uVar3 & 1) != 0) {
        *(undefined8 *)((long)local_378 + local_460) = *(undefined8 *)((long)&local_3d8 + local_460)
        ;
      }
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,-1,0,3,3>>::
      ColPivHouseholderQR<Eigen::Matrix<double,3,_1,0,3,3>>
                ((ColPivHouseholderQR<Eigen::Matrix<double,3,_1,0,3,3>> *)&local_160,
                 (EigenBase<Eigen::Matrix<double,_3,__1,_0,_3,_3>_> *)local_378);
      local_378[0] = &local_3a8;
      local_368 = &local_3d8;
      local_360 = 0;
      local_358 = 2;
      local_350 = 3;
      if (local_160.m_isInitialized == false) {
        local_488[0] = local_498;
        __assert_fail("derived().m_isInitialized && \"Solver is not initialized.\"",
                      "/usr/include/eigen3/Eigen/src/Core/SolverBase.h",0x96,
                      "void Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, -1, 0, 3, 3>>>::_check_solve_assertion(const Rhs &) const [Derived = Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, -1, 0, 3, 3>>, Transpose_ = false, Rhs = Eigen::MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, 3, 3>, 3, 1, true>>>]"
                     );
      }
      local_388.m_dec = &local_160;
      local_388.m_rhs =
           (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
            *)local_378;
      if (local_160.m_qr.super_PlainObjectBase<Eigen::Matrix<double,_3,__1,_0,_3,_3>_>.m_storage.
          m_cols != 2) {
        local_488[0] = local_498;
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, 2, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 2, 1>]"
                     );
      }
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_-1,_0,_3,_3>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_278,&local_388,&local_499);
      lVar5 = (sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>)
              .m_storage.m_rows;
      if ((lVar5 < 1) ||
         ((sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols <= (long)uVar7)) {
LAB_0016079e:
        local_488[0] = local_498;
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<std::complex<double>, -1, -1>, Level = 1]"
                     );
      }
      pcVar1 = (sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>
               ).m_storage.m_data;
      lVar5 = lVar5 * uVar7;
      *(double *)pcVar1[lVar5]._M_value = local_498;
      *(undefined8 *)(pcVar1[lVar5]._M_value + 8) = 0;
      lVar5 = (sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>)
              .m_storage.m_rows;
      if ((lVar5 < 2) ||
         ((sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols <= (long)uVar7)) goto LAB_0016079e;
      pcVar1 = (sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>
               ).m_storage.m_data;
      lVar5 = lVar5 * uVar7;
      *(double *)pcVar1[lVar5 + 1]._M_value =
           local_278.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
           array[1];
      *(undefined8 *)(pcVar1[lVar5 + 1]._M_value + 8) = 0;
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_458);
  }
  return;
}

Assistant:

inline void fast_eigenvector_solver(
    double *eigv,
    int neig,
    const Eigen::Matrix<double, 11, 11> &AM,
    Eigen::MatrixXcd *sols) {
    static const int ind[] = {0, 1, 5};
    // Truncated action matrix containing non-trivial rows
    Eigen::Matrix<double, 3, 11> AMs;
    double zi[5];

    for (int i = 0; i < 3; i++) {
        AMs.row(i) = AM.row(ind[i]);
    }
    for (int i = 0; i < neig; i++) {
        zi[0] = eigv[i];
        for (int j = 1; j < 5; j++) {
            zi[j] = zi[j - 1] * eigv[i];
        }
        Eigen::Matrix3d AA;
        AA.col(0) = zi[3] * AMs.col(0) + zi[2] * AMs.col(2) + zi[1] * AMs.col(4);
        AA.col(1) = zi[3] * AMs.col(1) + zi[2] * AMs.col(3) + zi[1] * AMs.col(6) + zi[0] * AMs.col(8);
        AA.col(2) = zi[2] * AMs.col(5) + zi[1] * AMs.col(7) + zi[0] * AMs.col(9) + AMs.col(10);
        AA(0, 0) = AA(0, 0) - zi[4];
        AA(1, 1) = AA(1, 1) - zi[4];
        AA(2, 2) = AA(2, 2) - zi[3];

        Eigen::Vector2d s = AA.leftCols(2).colPivHouseholderQr().solve(-AA.col(2));
        (*sols)(0, i) = zi[0];
        (*sols)(1, i) = s(1);
    }
}